

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice,RK_S32 cur_list)

{
  RK_U32 RVar1;
  RK_S32 local_70;
  MppFrame local_68;
  MppFrame mframe;
  H264_StorePic_t *pHStack_58;
  RK_U32 error_flag;
  H264_StorePic_t *tmp;
  H264dVideoCtx_t *p_Vid;
  RK_S32 *long_term_pic_idx;
  RK_S32 *abs_diff_pic_num_minus1;
  RK_S32 *modification_of_pic_nums_idc;
  RK_S32 picNumLX;
  RK_S32 picNumLXPred;
  RK_S32 picNumLXNoWrap;
  RK_S32 currPicNum;
  RK_S32 maxPicNum;
  RK_U32 dpb_error_flag;
  RK_S32 i;
  RK_S32 cur_list_local;
  H264_SLICE_t *currSlice_local;
  
  currPicNum = 0;
  picNumLX = 0;
  modification_of_pic_nums_idc._0_4_ = 0;
  abs_diff_pic_num_minus1 = currSlice->modification_of_pic_nums_idc[cur_list];
  long_term_pic_idx = currSlice->abs_diff_pic_num_minus1[cur_list];
  p_Vid = (H264dVideoCtx_t *)currSlice->long_term_pic_idx[cur_list];
  tmp = (H264_StorePic_t *)currSlice->p_Vid;
  if (currSlice->structure == 3) {
    picNumLXNoWrap = ((h264d_video_ctx_t *)tmp)->max_frame_num;
    picNumLXPred = currSlice->frame_num;
  }
  else {
    picNumLXNoWrap = ((h264d_video_ctx_t *)tmp)->max_frame_num << 1;
    picNumLXPred = currSlice->frame_num * 2 + 1;
  }
  modification_of_pic_nums_idc._4_4_ = picNumLXPred;
  dpb_error_flag = cur_list;
  _i = currSlice;
  for (maxPicNum = 0; abs_diff_pic_num_minus1[maxPicNum] != 3 && maxPicNum < 0x21;
      maxPicNum = maxPicNum + 1) {
    pHStack_58 = (H264_StorePic_t *)0x0;
    mframe._4_4_ = 0;
    if (abs_diff_pic_num_minus1[maxPicNum] < 4) {
      if (abs_diff_pic_num_minus1[maxPicNum] < 2) {
        if (abs_diff_pic_num_minus1[maxPicNum] == 0) {
          if (modification_of_pic_nums_idc._4_4_ - (long_term_pic_idx[maxPicNum] + 1) < 0) {
            picNumLX = (modification_of_pic_nums_idc._4_4_ - (long_term_pic_idx[maxPicNum] + 1)) +
                       picNumLXNoWrap;
          }
          else {
            picNumLX = modification_of_pic_nums_idc._4_4_ - (long_term_pic_idx[maxPicNum] + 1);
          }
        }
        else if (modification_of_pic_nums_idc._4_4_ + long_term_pic_idx[maxPicNum] + 1 <
                 picNumLXNoWrap) {
          picNumLX = modification_of_pic_nums_idc._4_4_ + long_term_pic_idx[maxPicNum] + 1;
        }
        else {
          picNumLX = (modification_of_pic_nums_idc._4_4_ + long_term_pic_idx[maxPicNum] + 1) -
                     picNumLXNoWrap;
        }
        modification_of_pic_nums_idc._4_4_ = picNumLX;
        if (picNumLXPred < picNumLX) {
          local_70 = picNumLX - picNumLXNoWrap;
        }
        else {
          local_70 = picNumLX;
        }
        modification_of_pic_nums_idc._0_4_ = local_70;
        mframe._4_4_ = 1;
        RVar1 = get_short_term_pic(_i,local_70,&stack0xffffffffffffffa8);
        if (RVar1 != 0) {
          local_68 = (MppFrame)0x0;
          if ((h264d_debug & 0x1000) != 0) {
            _mpp_log_l(4,"h264d_init","find short reference, slot_idx=%d.\n",(char *)0x0,
                       (ulong)(uint)pHStack_58->mem_mark->slot_idx);
          }
          if ((((pHStack_58 != (H264_StorePic_t *)0x0) &&
               (pHStack_58->mem_mark != (h264_dpb_mark_t *)0x0)) &&
              (-1 < pHStack_58->mem_mark->slot_idx)) &&
             ((mpp_buf_slot_get_prop
                         (*(MppBufSlots *)(*(long *)&tmp[0xb].frame_mbs_only_flag + 0x68),
                          pHStack_58->mem_mark->slot_idx,SLOT_FRAME_PTR,&local_68),
              local_68 != (MppFrame)0x0 && (RVar1 = mpp_frame_get_errinfo(local_68), RVar1 == 0))))
          {
            mframe._4_4_ = 0;
          }
        }
      }
      else {
        get_long_term_pic(_i,*(RK_S32 *)((long)p_Vid->spsSet + (long)maxPicNum * 4));
      }
      currPicNum = mframe._4_4_ | currPicNum;
    }
  }
  return currPicNum;
}

Assistant:

static RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice, RK_S32 cur_list)
{
    RK_S32 i = 0;
    RK_U32 dpb_error_flag = 0;
    RK_S32 maxPicNum = 0, currPicNum = 0;
    RK_S32 picNumLXNoWrap = 0, picNumLXPred = 0, picNumLX = 0;

    RK_S32 *modification_of_pic_nums_idc = currSlice->modification_of_pic_nums_idc[cur_list];
    RK_S32 *abs_diff_pic_num_minus1 = currSlice->abs_diff_pic_num_minus1[cur_list];
    RK_S32 *long_term_pic_idx = currSlice->long_term_pic_idx[cur_list];
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;

    if (currSlice->structure == FRAME) {
        maxPicNum  = p_Vid->max_frame_num;
        currPicNum = currSlice->frame_num;
    } else {
        maxPicNum  = 2 * p_Vid->max_frame_num;
        currPicNum = 2 * currSlice->frame_num + 1;
    }
    picNumLXPred = currPicNum;
    for (i = 0; modification_of_pic_nums_idc[i] != 3 && i < MAX_REORDER_TIMES; i++) {
        H264_StorePic_t *tmp = NULL;
        RK_U32 error_flag = 0;
        if (modification_of_pic_nums_idc[i] > 3)
            continue;
        if (modification_of_pic_nums_idc[i] < 2) {
            if (modification_of_pic_nums_idc[i] == 0) {
                if ( (picNumLXPred - (abs_diff_pic_num_minus1[i] + 1)) < 0)
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1) + maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1);
            } else { //!< (modification_of_pic_nums_idc[i] == 1)
                if (picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) >= maxPicNum)
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) - maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1);
            }
            picNumLXPred = picNumLXNoWrap;
            picNumLX = (picNumLXNoWrap > currPicNum) ? (picNumLXNoWrap - maxPicNum) : picNumLXNoWrap;
            error_flag = 1;
            if (get_short_term_pic(currSlice, picNumLX, &tmp)) { //!< find short reference
                MppFrame mframe = NULL;
                H264D_DBG(H264D_DBG_DPB_REF_ERR, "find short reference, slot_idx=%d.\n", tmp->mem_mark->slot_idx);
                if (tmp && tmp->mem_mark && tmp->mem_mark->slot_idx >= 0) {
                    mpp_buf_slot_get_prop(p_Vid->p_Dec->frame_slots, tmp->mem_mark->slot_idx, SLOT_FRAME_PTR, &mframe);
                    if (mframe && !mpp_frame_get_errinfo(mframe)) {
                        error_flag = 0;
                    }
                }
            }

        } else { //!< (modification_of_pic_nums_idc[i] == 2)
            tmp = get_long_term_pic(currSlice, long_term_pic_idx[i]);
        }
        dpb_error_flag |= error_flag;
    }

    return dpb_error_flag;
}